

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

void __thiscall
llm_graph_input_attn_temp::set_input(llm_graph_input_attn_temp *this,llama_ubatch *ubatch)

{
  ggml_tensor *pgVar1;
  long lVar2;
  long lVar3;
  ulong __n;
  int i;
  ulong uVar4;
  float fVar5;
  double dVar6;
  vector<float,_std::allocator<float>_> attn_scale_data;
  allocator_type local_3d;
  value_type_conflict5 local_3c;
  _Vector_base<float,_std::allocator<float>_> local_38;
  
  if ((ubatch->pos != (llama_pos *)0x0) && (this->attn_scale != (ggml_tensor *)0x0)) {
    __n = (ulong)ubatch->n_tokens;
    local_3c = 0.0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&local_38,__n,&local_3c,&local_3d);
    for (uVar4 = 0; __n != uVar4; uVar4 = uVar4 + 1) {
      fVar5 = floorf(((float)ubatch->pos[uVar4] + 1.0) / (float)this->n_attn_temp_floor_scale);
      dVar6 = log((double)fVar5 + 1.0);
      local_38._M_impl.super__Vector_impl_data._M_start[uVar4] =
           (float)((double)this->f_attn_temp_scale * dVar6 + 1.0);
    }
    pgVar1 = this->attn_scale;
    lVar2 = this->n_pos_per_token;
    lVar3 = ggml_element_size(pgVar1);
    ggml_backend_tensor_set
              (pgVar1,local_38._M_impl.super__Vector_impl_data._M_start,0,lVar2 * __n * lVar3);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_38);
  }
  return;
}

Assistant:

void llm_graph_input_attn_temp::set_input(const llama_ubatch * ubatch) {
    if (ubatch->pos && attn_scale) {
        const int64_t n_tokens = ubatch->n_tokens;

        std::vector<float> attn_scale_data(n_tokens, 0.0f);
        for (int i = 0; i < n_tokens; ++i) {
            const float pos = ubatch->pos[i];
            attn_scale_data[i] = std::log(
                std::floor((pos + 1.0f) / n_attn_temp_floor_scale) + 1.0
            ) * f_attn_temp_scale + 1.0;
        }

        ggml_backend_tensor_set(attn_scale, attn_scale_data.data(), 0, n_tokens*n_pos_per_token*ggml_element_size(attn_scale));
    }
}